

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [16];
  undefined1 auStack_b8 [32];
  undefined1 auStack_98 [16];
  undefined1 auStack_88 [8];
  uint16_t buffer [8];
  
  if ((len & 0x7f) != 0) {
    auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar19 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar1 = (ulong)(len & 0xffffff80);
    do {
      uVar1 = uVar1 + 1;
      auVar21 = vpbroadcastd_avx512f();
      auVar21 = vpsrlvd_avx512f(auVar21,auVar19);
      auVar21 = vpandd_avx512f(auVar21,auVar20);
      auVar18 = vpaddd_avx512f(auVar21,auVar18);
    } while (uVar1 < len);
    auVar18 = vmovdqu64_avx512f(auVar18);
    *(undefined1 (*) [64])flags = auVar18;
  }
  uVar3 = len >> 3 & 0xfffffff0;
  uVar1 = (ulong)uVar3;
  if (uVar3 != 0) {
    auVar22._8_2_ = 1;
    auVar22._0_8_ = 0x1000100010001;
    auVar22._10_2_ = 1;
    auVar22._12_2_ = 1;
    auVar22._14_2_ = 1;
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    uVar2 = 0;
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = (undefined1  [16])0x0;
    do {
      vmovdqu64_avx512f(auVar20);
      auVar25 = vmovdqu64_avx512f(auVar20);
      stack0xffffffffffffff88 = auVar25._0_16_;
      _auStack_b8 = vmovdqu64_avx512f(auVar20);
      _local_f8 = vmovdqu64_avx512f(auVar20);
      uVar4 = uVar2 + 0xffff;
      if (uVar1 - uVar2 < 0x10000) {
        uVar4 = uVar1;
      }
      if (uVar2 < uVar4) {
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        auVar28 = ZEXT1664((undefined1  [16])0x0);
        auVar29 = ZEXT1664((undefined1  [16])0x0);
        auVar30 = ZEXT1664((undefined1  [16])0x0);
        auVar31 = ZEXT1664((undefined1  [16])0x0);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        auVar7 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar7);
        auVar7 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar7);
        auVar7 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar7);
        auVar7 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar7);
        auVar7 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar7);
        auVar7 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar7);
        auVar7 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar7);
        auVar25 = ZEXT1664((undefined1  [16])0x0);
        pauVar6 = (undefined1 (*) [16])(array + uVar2 * 8 + 0x78);
        do {
          auVar7 = vmovdqu64_avx512vl(pauVar6[-0xf]);
          auVar8 = vmovdqu64_avx512vl(pauVar6[-0xe]);
          auVar9 = vmovdqu64_avx512vl(pauVar6[-0xd]);
          auVar10 = vmovdqu64_avx512vl(pauVar6[-0xc]);
          uVar2 = uVar2 + 0x10;
          auVar11 = vpxorq_avx512vl(auVar7,auVar24._0_16_);
          auVar12 = vpandq_avx512vl(auVar11,auVar8);
          auVar7 = vpternlogq_avx512vl(auVar12,auVar7,auVar24._0_16_,0xf8);
          auVar8 = vpxorq_avx512vl(auVar11,auVar8);
          auVar11 = vpxorq_avx512vl(auVar8,auVar9);
          auVar12 = vpandq_avx512vl(auVar11,auVar10);
          auVar8 = vpternlogq_avx512vl(auVar12,auVar8,auVar9,0xf8);
          auVar9 = vpxorq_avx512vl(auVar11,auVar10);
          auVar10 = vpxorq_avx512vl(auVar7,auVar21._0_16_);
          auVar11 = vpandq_avx512vl(auVar8,auVar10);
          auVar7 = vpternlogq_avx512vl(auVar11,auVar7,auVar21._0_16_,0xf8);
          auVar8 = vpxorq_avx512vl(auVar8,auVar10);
          auVar10 = vmovdqu64_avx512vl(pauVar6[-0xb]);
          auVar11 = vmovdqu64_avx512vl(pauVar6[-10]);
          auVar12 = vpxorq_avx512vl(auVar9,auVar10);
          auVar13 = vpandq_avx512vl(auVar12,auVar11);
          auVar9 = vpternlogq_avx512vl(auVar13,auVar9,auVar10,0xf8);
          auVar10 = vmovdqu64_avx512vl(pauVar6[-9]);
          auVar11 = vpxorq_avx512vl(auVar12,auVar11);
          auVar12 = vmovdqu64_avx512vl(pauVar6[-8]);
          auVar13 = vpxorq_avx512vl(auVar11,auVar10);
          auVar14 = vpandq_avx512vl(auVar13,auVar12);
          auVar10 = vpternlogq_avx512vl(auVar14,auVar11,auVar10,0xf8);
          auVar11 = vpxorq_avx512vl(auVar9,auVar8);
          auVar12 = vpxorq_avx512vl(auVar13,auVar12);
          auVar13 = vpxorq_avx512vl(auVar7,auVar19._0_16_);
          auVar14 = vpandq_avx512vl(auVar10,auVar11);
          auVar8 = vpternlogq_avx512vl(auVar14,auVar9,auVar8,0xf8);
          auVar9 = vpxorq_avx512vl(auVar10,auVar11);
          auVar10 = vpandq_avx512vl(auVar8,auVar13);
          auVar7 = vpternlogq_avx512vl(auVar10,auVar7,auVar19._0_16_,0xf8);
          auVar8 = vpxorq_avx512vl(auVar8,auVar13);
          auVar10 = vmovdqu64_avx512vl(pauVar6[-7]);
          auVar11 = vmovdqu64_avx512vl(pauVar6[-6]);
          auVar13 = vpxorq_avx512vl(auVar12,auVar10);
          auVar14 = vpandq_avx512vl(auVar13,auVar11);
          auVar10 = vpternlogq_avx512vl(auVar14,auVar12,auVar10,0xf8);
          auVar12 = vmovdqu64_avx512vl(pauVar6[-5]);
          auVar11 = vpxorq_avx512vl(auVar13,auVar11);
          auVar13 = vmovdqu64_avx512vl(pauVar6[-4]);
          auVar14 = vpxorq_avx512vl(auVar11,auVar12);
          auVar15 = vpandq_avx512vl(auVar14,auVar13);
          auVar11 = vpternlogq_avx512vl(auVar15,auVar11,auVar12,0xf8);
          auVar12 = vpxorq_avx512vl(auVar10,auVar9);
          auVar13 = vpxorq_avx512vl(auVar14,auVar13);
          auVar14 = vmovdqu64_avx512vl(pauVar6[-2]);
          auVar15 = vpandq_avx512vl(auVar11,auVar12);
          auVar9 = vpternlogq_avx512vl(auVar15,auVar10,auVar9,0xf8);
          auVar10 = vpxorq_avx512vl(auVar11,auVar12);
          auVar11 = vmovdqu64_avx512vl(pauVar6[-3]);
          auVar12 = vpxorq_avx512vl(auVar13,auVar11);
          auVar15 = vpandq_avx512vl(auVar12,auVar14);
          auVar11 = vpternlogq_avx512vl(auVar15,auVar13,auVar11,0xf8);
          auVar13 = vmovdqu64_avx512vl(pauVar6[-1]);
          auVar12 = vpxorq_avx512vl(auVar12,auVar14);
          auVar14 = vmovdqu64_avx512vl(*pauVar6);
          pauVar6 = pauVar6 + 0x10;
          auVar15 = vpxorq_avx512vl(auVar12,auVar13);
          auVar16 = vpandq_avx512vl(auVar15,auVar14);
          auVar12 = vpternlogq_avx512vl(auVar16,auVar12,auVar13,0xf8);
          auVar13 = vpxorq_avx512vl(auVar11,auVar10);
          auVar14 = vpxorq_avx512vl(auVar15,auVar14);
          auVar24 = ZEXT1664(auVar14);
          auVar14 = vpandq_avx512vl(auVar12,auVar13);
          auVar10 = vpternlogq_avx512vl(auVar14,auVar11,auVar10,0xf8);
          auVar11 = vpxorq_avx512vl(auVar12,auVar13);
          auVar21 = ZEXT1664(auVar11);
          auVar11 = vpxorq_avx512vl(auVar9,auVar8);
          auVar12 = vpandq_avx512vl(auVar10,auVar11);
          auVar8 = vpternlogq_avx512vl(auVar12,auVar9,auVar8,0xf8);
          auVar9 = vpxorq_avx512vl(auVar10,auVar11);
          auVar19 = ZEXT1664(auVar9);
          auVar9 = vpandq_avx512vl(auVar23,auVar22);
          auVar10 = vpxorq_avx512vl(auVar7,auVar18._0_16_);
          local_108 = vpaddw_avx512vl(auVar25._0_16_,auVar9);
          auVar25 = ZEXT1664(local_108);
          auVar9 = vpsrlw_avx512vl(auVar23,1);
          auVar9 = vpandq_avx512vl(auVar9,auVar22);
          auVar9 = vpaddw_avx512vl(in_ZMM22._0_16_,auVar9);
          in_ZMM22 = ZEXT1664(auVar9);
          auVar11 = vpsrlw_avx512vl(auVar23,2);
          auVar11 = vpandq_avx512vl(auVar11,auVar22);
          auVar11 = vpaddw_avx512vl(in_ZMM21._0_16_,auVar11);
          in_ZMM21 = ZEXT1664(auVar11);
          auVar12 = vpsrlw_avx512vl(auVar23,3);
          auVar12 = vpandq_avx512vl(auVar12,auVar22);
          auVar12 = vpaddw_avx512vl(in_ZMM20._0_16_,auVar12);
          in_ZMM20 = ZEXT1664(auVar12);
          auVar13 = vpsrlw_avx512vl(auVar23,4);
          auVar13 = vpandq_avx512vl(auVar13,auVar22);
          auVar13 = vpaddw_avx512vl(in_ZMM19._0_16_,auVar13);
          in_ZMM19 = ZEXT1664(auVar13);
          auVar14 = vpsrlw_avx512vl(auVar23,5);
          auVar14 = vpandq_avx512vl(auVar14,auVar22);
          auVar14 = vpaddw_avx512vl(in_ZMM18._0_16_,auVar14);
          in_ZMM18 = ZEXT1664(auVar14);
          auVar15 = vpsrlw_avx512vl(auVar23,6);
          auVar15 = vpandq_avx512vl(auVar15,auVar22);
          auVar15 = vpaddw_avx512vl(in_ZMM17._0_16_,auVar15);
          in_ZMM17 = ZEXT1664(auVar15);
          auVar16 = vpsrlw_avx512vl(auVar23,7);
          auVar16 = vpandq_avx512vl(auVar16,auVar22);
          auVar16 = vpaddw_avx512vl(in_ZMM16._0_16_,auVar16);
          in_ZMM16 = ZEXT1664(auVar16);
          auVar17 = vpsrlw_avx512vl(auVar23,8);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          _auStack_88 = vpaddw_avx512vl(auVar34._0_16_,auVar17);
          auVar34 = ZEXT1664(_auStack_88);
          auVar17 = vpsrlw_avx512vl(auVar23,9);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          register0x000008fc = vpaddw_avx512vl(auVar33._0_16_,auVar17);
          auVar33 = ZEXT1664(register0x000008fc);
          auVar17 = vpsrlw_avx512vl(auVar23,10);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          auVar17 = vpaddw_avx512vl(auVar32._0_16_,auVar17);
          auVar32 = ZEXT1664(auVar17);
          auVar17 = vpsrlw_avx512vl(auVar23,0xb);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          auVar17 = vpaddw_avx512vl(auVar31._0_16_,auVar17);
          auVar31 = ZEXT1664(auVar17);
          auVar17 = vpsrlw_avx512vl(auVar23,0xc);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          auVar17 = vpaddw_avx512vl(auVar30._0_16_,auVar17);
          auVar30 = ZEXT1664(auVar17);
          auVar17 = vpsrlw_avx512vl(auVar23,0xd);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          auVar17 = vpaddw_avx512vl(auVar29._0_16_,auVar17);
          auVar29 = ZEXT1664(auVar17);
          auVar17 = vpsrlw_avx512vl(auVar23,0xe);
          auVar23 = vpsrlw_avx(auVar23,0xf);
          auVar17 = vpandq_avx512vl(auVar17,auVar22);
          auVar23 = vpaddw_avx(auVar26._0_16_,auVar23);
          auVar26 = ZEXT1664(auVar23);
          auVar23 = vpandq_avx512vl(auVar8,auVar10);
          auVar23 = vpternlogq_avx512vl(auVar23,auVar7,auVar18._0_16_,0xf8);
          auVar7 = vpaddw_avx512vl(auVar28._0_16_,auVar17);
          auVar28 = ZEXT1664(auVar7);
          auVar7 = vpxorq_avx512vl(auVar8,auVar10);
          auVar18 = ZEXT1664(auVar7);
        } while (uVar2 < uVar4);
        local_f8._0_16_ = vmovdqa64_avx512vl(auVar9);
        local_f8._16_16_ = vmovdqa64_avx512vl(auVar11);
        auStack_d8 = vmovdqa64_avx512vl(auVar12);
        auStack_c8 = vmovdqa64_avx512vl(auVar13);
        auStack_b8._0_16_ = vmovdqa64_avx512vl(auVar14);
        auStack_b8._16_16_ = vmovdqa64_avx512vl(auVar15);
        auStack_98 = vmovdqa64_avx512vl(auVar16);
      }
      else {
        local_108 = (undefined1  [16])0x0;
      }
      lVar5 = 0;
      do {
        auVar7 = vpand_avx(auVar23,auVar22);
        auVar7 = vpaddw_avx(auVar7,*(undefined1 (*) [16])(local_108 + lVar5));
        auVar23 = vpsrlw_avx(auVar23,1);
        *(undefined1 (*) [16])(local_108 + lVar5) = auVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x100);
      lVar5 = 0;
      do {
        auVar27 = vpmovzxwd_avx2(*(undefined1 (*) [16])(local_108 + lVar5 * 4));
        auVar27 = vpslld_avx2(auVar27,4);
        auVar27 = vpaddd_avx2(auVar27,ZEXT432(*(uint *)((long)flags + lVar5)));
        auVar7 = vphaddd_avx(auVar27._16_16_,auVar27._0_16_);
        auVar7 = vphaddd_avx(auVar7,auVar7);
        auVar7 = vphaddd_avx(auVar7,auVar7);
        *(int *)((long)flags + lVar5) = auVar7._0_4_;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x40);
    } while (uVar2 < uVar1);
  }
  auVar18 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
  lVar5 = 0;
  auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar5 = lVar5 + 1;
    auVar21 = vpbroadcastd_avx512f();
    auVar21 = vpsrlvd_avx512f(auVar21,auVar18);
    auVar21 = vpandd_avx512f(auVar21,auVar19);
    auVar20 = vpaddd_avx512f(auVar21,auVar20);
  } while (lVar5 != 8);
  auVar19 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])flags = auVar19;
  auVar19 = vpbroadcastd_avx512f(ZEXT416(2));
  lVar5 = 0;
  auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar5 = lVar5 + 1;
    auVar21 = vpbroadcastd_avx512f();
    auVar21 = vpsrlvd_avx512f(auVar21,auVar18);
    auVar21 = vpaddd_avx512f(auVar21,auVar21);
    auVar21 = vpandd_avx512f(auVar21,auVar19);
    auVar20 = vpaddd_avx512f(auVar21,auVar20);
  } while (lVar5 != 8);
  auVar19 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])flags = auVar19;
  auVar19 = vpbroadcastd_avx512f(ZEXT416(4));
  lVar5 = 0;
  auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar5 = lVar5 + 1;
    auVar21 = vpbroadcastd_avx512f();
    auVar21 = vpsrlvd_avx512f(auVar21,auVar18);
    auVar21 = vpslld_avx512f(auVar21,2);
    auVar21 = vpandd_avx512f(auVar21,auVar19);
    auVar20 = vpaddd_avx512f(auVar21,auVar20);
  } while (lVar5 != 8);
  auVar19 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])flags = auVar19;
  auVar19 = vpbroadcastd_avx512f(ZEXT416(8));
  lVar5 = 0;
  auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar5 = lVar5 + 1;
    auVar21 = vpbroadcastd_avx512f();
    auVar21 = vpsrlvd_avx512f(auVar21,auVar18);
    auVar21 = vpslld_avx512f(auVar21,3);
    auVar21 = vpandd_avx512f(auVar21,auVar19);
    auVar20 = vpaddd_avx512f(auVar21,auVar20);
  } while (lVar5 != 8);
  auVar18 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])flags = auVar18;
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[16];

    while (i < limit) {        
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm_add_epi16(counter[pos], _mm_and_si128(v16, _mm_set1_epi16(1))); \
    v16 = _mm_srli_epi16(v16, 1); \
}
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
#undef U
        }

        // update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_add_epi16(counter[i], _mm_and_si128(v16, _mm_set1_epi16(1)));
            v16 = _mm_srli_epi16(v16, 1);
        }
        
        for (size_t i = 0; i < 16; ++i) {
            _mm_storeu_si128((__m128i*)buffer, counter[i]);
            for (size_t z = 0; z < 8; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}